

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

string * __thiscall
CBuildVisitor::GetMethodFullName
          (string *__return_storage_ptr__,CBuildVisitor *this,string *className,string *methodName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,className,"$$");
  std::operator+(__return_storage_ptr__,&bStack_38,methodName);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CBuildVisitor::GetMethodFullName( const std::string &className, const std::string &methodName ) {
    return className + "$$" + methodName;
}